

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O3

void __thiscall tinyusdz::PrimSpec::PrimSpec(PrimSpec *this)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  
  this->_specifier = Def;
  (this->_typeName)._M_dataplus._M_p = (pointer)&(this->_typeName).field_2;
  (this->_typeName)._M_string_length = 0;
  (this->_typeName).field_2._M_local_buf[0] = '\0';
  (this->_name)._M_dataplus._M_p = (pointer)&(this->_name).field_2;
  (this->_name)._M_string_length = 0;
  (this->_name).field_2._M_local_buf[0] = '\0';
  (this->_children).super__Vector_base<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_children).super__Vector_base<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_children).super__Vector_base<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var1 = &(this->_props)._M_t._M_impl.super__Rb_tree_header;
  (this->_props)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->_props)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->_props)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->_props)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->_props)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->_current_vsmap)._M_t._M_impl.super__Rb_tree_header;
  (this->_current_vsmap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->_current_vsmap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->_current_vsmap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->_current_vsmap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->_current_vsmap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->_variantSets)._M_t._M_impl.super__Rb_tree_header;
  (this->_variantSets)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->_variantSets)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->_variantSets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->_variantSets)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->_metas).kind.contained = (storage_t<tinyusdz::Kind>)0x0;
  *(undefined8 *)
   ((long)&(this->_variantChildren).
           super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 5) = 0;
  (this->_variantChildren).super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_variantChildren).super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_properties).super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_variantChildren).super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_properties).super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_properties).super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_primChildren).super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_primChildren).super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_variantSets)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->_primChildren).super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_metas)._kind_str._M_dataplus._M_p = (pointer)&(this->_metas)._kind_str.field_2;
  (this->_metas)._kind_str._M_string_length = 0;
  (this->_metas)._kind_str.field_2._M_local_buf[0] = '\0';
  (this->_metas).assetInfo.has_value_ = false;
  (this->_metas).clips.has_value_ = false;
  *(undefined8 *)&(this->_metas).displayName.contained = 0;
  *(undefined8 *)((long)&(this->_metas).displayName.contained + 8) = 0;
  *(undefined8 *)((long)&(this->_metas).displayName.contained + 0x10) = 0;
  *(undefined8 *)((long)&(this->_metas).displayName.contained + 0x18) = 0;
  p_Var2 = &(this->_metas).unregisteredMetas._M_t._M_impl.super__Rb_tree_header;
  (this->_metas).unregisteredMetas._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->_metas).unregisteredMetas._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  *(undefined8 *)&(this->_metas).assetInfo.contained = 0;
  *(undefined8 *)((long)&(this->_metas).assetInfo.contained + 8) = 0;
  *(undefined8 *)((long)&(this->_metas).assetInfo.contained + 0x10) = 0;
  *(undefined8 *)((long)&(this->_metas).assetInfo.contained + 0x18) = 0;
  *(undefined8 *)((long)&(this->_metas).assetInfo.contained + 0x20) = 0;
  *(undefined8 *)((long)&(this->_metas).assetInfo.contained + 0x28) = 0;
  (this->_metas).customData.has_value_ = false;
  (this->_metas).doc.has_value_ = false;
  *(undefined8 *)((long)&(this->_metas).customData.contained + 0x20) = 0;
  *(undefined8 *)((long)&(this->_metas).customData.contained + 0x28) = 0;
  *(undefined8 *)((long)&(this->_metas).customData.contained + 0x10) = 0;
  *(undefined8 *)((long)&(this->_metas).customData.contained + 0x18) = 0;
  *(undefined8 *)&(this->_metas).customData.contained = 0;
  *(undefined8 *)((long)&(this->_metas).customData.contained + 8) = 0;
  (this->_metas).comment.has_value_ = false;
  *(undefined8 *)((long)&(this->_metas).doc.contained + 0x20) = 0;
  *(undefined8 *)((long)&(this->_metas).doc.contained + 0x28) = 0;
  *(undefined8 *)((long)&(this->_metas).doc.contained + 0x10) = 0;
  *(undefined8 *)((long)&(this->_metas).doc.contained + 0x18) = 0;
  *(undefined8 *)&(this->_metas).doc.contained = 0;
  *(undefined8 *)((long)&(this->_metas).doc.contained + 8) = 0;
  (this->_metas).apiSchemas.has_value_ = false;
  *(undefined8 *)((long)&(this->_metas).comment.contained + 0x20) = 0;
  *(undefined8 *)((long)&(this->_metas).comment.contained + 0x28) = 0;
  *(undefined8 *)((long)&(this->_metas).comment.contained + 0x10) = 0;
  *(undefined8 *)((long)&(this->_metas).comment.contained + 0x18) = 0;
  *(undefined8 *)&(this->_metas).comment.contained = 0;
  *(undefined8 *)((long)&(this->_metas).comment.contained + 8) = 0;
  (this->_metas).sdrMetadata.has_value_ = false;
  *(undefined8 *)((long)&(this->_metas).apiSchemas.contained + 0x10) = 0;
  *(undefined8 *)((long)&(this->_metas).apiSchemas.contained + 0x18) = 0;
  *(undefined8 *)&(this->_metas).apiSchemas.contained = 0;
  *(undefined8 *)((long)&(this->_metas).apiSchemas.contained + 8) = 0;
  *(undefined8 *)((long)&(this->_metas).sdrMetadata.contained + 0x20) = 0;
  *(undefined8 *)((long)&(this->_metas).sdrMetadata.contained + 0x28) = 0;
  *(undefined8 *)((long)&(this->_metas).sdrMetadata.contained + 0x10) = 0;
  *(undefined8 *)((long)&(this->_metas).sdrMetadata.contained + 0x18) = 0;
  *(undefined8 *)&(this->_metas).sdrMetadata.contained = 0;
  *(undefined8 *)((long)&(this->_metas).sdrMetadata.contained + 8) = 0;
  (this->_metas).instanceable.has_value_ = false;
  (this->_metas).instanceable.contained = (storage_t<bool>)0x0;
  (this->_metas).references.has_value_ = false;
  *(undefined8 *)((long)&(this->_metas).clips.contained + 0x20) = 0;
  *(undefined8 *)((long)&(this->_metas).clips.contained + 0x28) = 0;
  *(undefined8 *)((long)&(this->_metas).clips.contained + 0x10) = 0;
  *(undefined8 *)((long)&(this->_metas).clips.contained + 0x18) = 0;
  *(undefined8 *)&(this->_metas).clips.contained = 0;
  *(undefined8 *)((long)&(this->_metas).clips.contained + 8) = 0;
  (this->_metas).payload.has_value_ = false;
  *(undefined8 *)((long)&(this->_metas).references.contained + 0x10) = 0;
  *(undefined8 *)((long)&(this->_metas).references.contained + 0x18) = 0;
  *(undefined8 *)&(this->_metas).references.contained = 0;
  *(undefined8 *)((long)&(this->_metas).references.contained + 8) = 0;
  (this->_metas).inherits.has_value_ = false;
  *(undefined8 *)((long)&(this->_metas).payload.contained + 0x10) = 0;
  *(undefined8 *)((long)&(this->_metas).payload.contained + 0x18) = 0;
  *(undefined8 *)&(this->_metas).payload.contained = 0;
  *(undefined8 *)((long)&(this->_metas).payload.contained + 8) = 0;
  (this->_metas).variantSets.has_value_ = false;
  *(undefined8 *)((long)&(this->_metas).inherits.contained + 0x10) = 0;
  *(undefined8 *)((long)&(this->_metas).inherits.contained + 0x18) = 0;
  *(undefined8 *)&(this->_metas).inherits.contained = 0;
  *(undefined8 *)((long)&(this->_metas).inherits.contained + 8) = 0;
  (this->_metas).variants.has_value_ = false;
  *(undefined8 *)((long)&(this->_metas).variantSets.contained + 0x10) = 0;
  *(undefined8 *)((long)&(this->_metas).variantSets.contained + 0x18) = 0;
  *(undefined8 *)&(this->_metas).variantSets.contained = 0;
  *(undefined8 *)((long)&(this->_metas).variantSets.contained + 8) = 0;
  (this->_metas).specializes.has_value_ = false;
  *(undefined8 *)((long)&(this->_metas).variants.contained + 0x20) = 0;
  *(undefined8 *)((long)&(this->_metas).variants.contained + 0x28) = 0;
  *(undefined8 *)((long)&(this->_metas).variants.contained + 0x10) = 0;
  *(undefined8 *)((long)&(this->_metas).variants.contained + 0x18) = 0;
  *(undefined8 *)&(this->_metas).variants.contained = 0;
  *(undefined8 *)((long)&(this->_metas).variants.contained + 8) = 0;
  (this->_metas).sceneName.has_value_ = false;
  *(undefined8 *)((long)&(this->_metas).specializes.contained + 0x10) = 0;
  *(undefined8 *)((long)&(this->_metas).specializes.contained + 0x18) = 0;
  *(undefined8 *)&(this->_metas).specializes.contained = 0;
  *(undefined8 *)((long)&(this->_metas).specializes.contained + 8) = 0;
  (this->_metas).displayName.has_value_ = false;
  *(undefined8 *)((long)&(this->_metas).sceneName.contained + 0x10) = 0;
  *(undefined8 *)((long)&(this->_metas).sceneName.contained + 0x18) = 0;
  *(undefined8 *)&(this->_metas).sceneName.contained = 0;
  *(undefined8 *)((long)&(this->_metas).sceneName.contained + 8) = 0;
  (this->_metas).unregisteredMetas._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var2->_M_header;
  (this->_metas).unregisteredMetas._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var2->_M_header;
  (this->_metas).unregisteredMetas._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->_metas).meta._M_t._M_impl.super__Rb_tree_header;
  (this->_metas).meta._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->_metas).meta._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->_metas).meta._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->_metas).meta._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  *(undefined8 *)((long)&(this->_metas).variantSetChildren.contained + 0x10) = 0;
  *(undefined8 *)&(this->_metas).variantSetChildren.contained = 0;
  *(undefined8 *)((long)&(this->_metas).variantSetChildren.contained + 8) = 0;
  *(undefined8 *)
   ((long)&(this->_metas).properties.
           super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
           super__Vector_impl_data._M_finish + 1) = 0;
  *(undefined8 *)
   ((long)&(this->_metas).properties.
           super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 1) = 0;
  (this->_metas).properties.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_metas).properties.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_metas).primChildren.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_metas).primChildren.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_metas).meta._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->_metas).primChildren.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_metas).variantChildren.has_value_ = false;
  *(undefined8 *)((long)&(this->_metas).inheritPaths.contained + 0x10) = 0;
  *(undefined8 *)((long)&(this->_metas).inheritPaths.contained + 0x18) = 0;
  *(undefined8 *)&(this->_metas).inheritPaths.contained = 0;
  *(undefined8 *)((long)&(this->_metas).inheritPaths.contained + 8) = 0;
  *(undefined8 *)((long)&(this->_metas).variantChildren.contained + 9) = 0;
  *(undefined8 *)((long)&(this->_metas).variantChildren.contained + 0x11) = 0;
  *(undefined8 *)&(this->_metas).variantChildren.contained = 0;
  *(undefined8 *)((long)&(this->_metas).variantChildren.contained + 8) = 0;
  (this->_current_working_path)._M_dataplus._M_p = (pointer)&(this->_current_working_path).field_2;
  (this->_current_working_path)._M_string_length = 0;
  (this->_current_working_path).field_2._M_local_buf[0] = '\0';
  (this->_asset_search_paths).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_asset_search_paths).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_asset_search_paths).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  return;
}

Assistant:

PrimSpec() = default;